

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O2

void __thiscall IntVarSL::channel(IntVarSL *this,int val,LitRel val_type,int sign)

{
  IntVar::set(&this->el->super_IntVar,val,val_type * 3 ^ sign,false);
  if (val_type * 3 == sign) {
    Tchar::operator=((this->super_IntVar).vals + (this->values).data[(uint)val],'\0');
  }
  Tint::operator=(&(this->super_IntVar).min,
                  (this->values).data[(uint)(this->el->super_IntVar).min.v]);
  Tint::operator=(&(this->super_IntVar).max,
                  (this->values).data[(uint)(this->el->super_IntVar).max.v]);
  return;
}

Assistant:

void IntVarSL::channel(int val, LitRel val_type, int sign) {
	//	fprintf(stderr, "funny channel\n");
	auto type = static_cast<LitRel>(static_cast<int>(val_type) * 3 ^ sign);
	el->set(val, type, false);
	if (type == 0) {
		vals[values[val]] = 0;
	}
	min = values[el->min];
	max = values[el->max];
}